

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

char * MipsFCCToString(Mips_CondCode CC)

{
  Mips_CondCode CC_local;
  char *local_8;
  
  switch(CC) {
  case Mips_FCOND_F:
  case Mips_FCOND_T:
    local_8 = "f";
    break;
  case Mips_FCOND_UN:
  case Mips_FCOND_OR:
    local_8 = "un";
    break;
  case Mips_FCOND_OEQ:
  case Mips_FCOND_UNE:
    local_8 = "eq";
    break;
  case Mips_FCOND_UEQ:
  case Mips_FCOND_ONE:
    local_8 = "ueq";
    break;
  case Mips_FCOND_OLT:
  case Mips_FCOND_UGE:
    local_8 = "olt";
    break;
  case Mips_FCOND_ULT:
  case Mips_FCOND_OGE:
    local_8 = "ult";
    break;
  case Mips_FCOND_OLE:
  case Mips_FCOND_UGT:
    local_8 = "ole";
    break;
  case Mips_FCOND_ULE:
  case Mips_FCOND_OGT:
    local_8 = "ule";
    break;
  case Mips_FCOND_SF:
  case Mips_FCOND_ST:
    local_8 = "sf";
    break;
  case Mips_FCOND_NGLE:
  case Mips_FCOND_GLE:
    local_8 = "ngle";
    break;
  case Mips_FCOND_SEQ:
  case Mips_FCOND_SNE:
    local_8 = "seq";
    break;
  case Mips_FCOND_NGL:
  case Mips_FCOND_GL:
    local_8 = "ngl";
    break;
  case Mips_FCOND_LT:
  case Mips_FCOND_NLT:
    local_8 = "lt";
    break;
  case Mips_FCOND_NGE:
  case Mips_FCOND_GE:
    local_8 = "nge";
    break;
  case Mips_FCOND_LE:
  case Mips_FCOND_NLE:
    local_8 = "le";
    break;
  case Mips_FCOND_NGT:
  case Mips_FCOND_GT:
    local_8 = "ngt";
    break;
  default:
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char* MipsFCCToString(Mips_CondCode CC)
{
	switch (CC) {
		default: return 0;	// never reach
		case Mips_FCOND_F:
		case Mips_FCOND_T:   return "f";
		case Mips_FCOND_UN:
		case Mips_FCOND_OR:  return "un";
		case Mips_FCOND_OEQ:
		case Mips_FCOND_UNE: return "eq";
		case Mips_FCOND_UEQ:
		case Mips_FCOND_ONE: return "ueq";
		case Mips_FCOND_OLT:
		case Mips_FCOND_UGE: return "olt";
		case Mips_FCOND_ULT:
		case Mips_FCOND_OGE: return "ult";
		case Mips_FCOND_OLE:
		case Mips_FCOND_UGT: return "ole";
		case Mips_FCOND_ULE:
		case Mips_FCOND_OGT: return "ule";
		case Mips_FCOND_SF:
		case Mips_FCOND_ST:  return "sf";
		case Mips_FCOND_NGLE:
		case Mips_FCOND_GLE: return "ngle";
		case Mips_FCOND_SEQ:
		case Mips_FCOND_SNE: return "seq";
		case Mips_FCOND_NGL:
		case Mips_FCOND_GL:  return "ngl";
		case Mips_FCOND_LT:
		case Mips_FCOND_NLT: return "lt";
		case Mips_FCOND_NGE:
		case Mips_FCOND_GE:  return "nge";
		case Mips_FCOND_LE:
		case Mips_FCOND_NLE: return "le";
		case Mips_FCOND_NGT:
		case Mips_FCOND_GT:  return "ngt";
	}
}